

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::bytes_source,_std::allocator<char>_>::read_to
          (basic_cbor_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this,
          basic_json_visitor<char> *visitor,error_code *ec)

{
  bool bVar1;
  staj_event_type sVar2;
  int value;
  basic_staj_event<char> *pbVar3;
  error_code *in_RDX;
  long *in_RDI;
  error_code *unaff_retaddr;
  basic_json_visitor<char> *in_stack_00000008;
  ser_context *in_stack_00000028;
  basic_json_visitor<char> *in_stack_00000030;
  error_code *in_stack_00000098;
  ser_context *in_stack_000000a0;
  basic_json_visitor<char> *in_stack_000000a8;
  basic_staj_event<char> *in_stack_000000b0;
  error_code *in_stack_00000498;
  ser_context *in_stack_000004a0;
  basic_json_visitor<char> *in_stack_000004a8;
  basic_staj_visitor<char> *in_stack_000004b0;
  
  bVar1 = is_typed_array((basic_cbor_cursor<jsoncons::bytes_source,_std::allocator<char>_> *)
                         0x2a1322);
  if (bVar1) {
    basic_staj_visitor<char>::dump
              (in_stack_000004b0,in_stack_000004a8,in_stack_000004a0,in_stack_00000498);
  }
  else {
    pbVar3 = (basic_staj_event<char> *)(**(code **)(*in_RDI + 0x20))();
    sVar2 = basic_staj_event<char>::event_type(pbVar3);
    bVar1 = is_begin_container(sVar2);
    if (bVar1) {
      basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::cursor_mode
                ((basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *)(in_RDI + 1),
                 false);
      value = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::level
                        ((basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *)
                         0x2a139f);
      basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mark_level
                ((basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *)(in_RDI + 1),
                 value);
      basic_staj_visitor<char>::event((basic_staj_visitor<char> *)(in_RDI + 0x20));
      basic_staj_event<char>::send_json_event
                (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
      bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
      if (!bVar1) {
        read_next((basic_cbor_cursor<jsoncons::bytes_source,_std::allocator<char>_> *)ec,
                  in_stack_00000008,unaff_retaddr);
        basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::cursor_mode
                  ((basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *)(in_RDI + 1),
                   true);
        basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mark_level
                  ((basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *)(in_RDI + 1),
                   0);
        pbVar3 = (basic_staj_event<char> *)(**(code **)(*in_RDI + 0x20))();
        sVar2 = basic_staj_event<char>::event_type(pbVar3);
        if (sVar2 == begin_object) {
          basic_json_visitor<char>::end_object(in_stack_00000030,in_stack_00000028);
        }
        else {
          basic_json_visitor<char>::end_array(in_stack_00000030,in_stack_00000028);
        }
      }
    }
    else {
      basic_staj_visitor<char>::event((basic_staj_visitor<char> *)(in_RDI + 0x20));
      basic_staj_event<char>::send_json_event
                (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
    }
  }
  return;
}

Assistant:

void read_to(basic_json_visitor<char_type>& visitor,
        std::error_code& ec) override
    {
        if (is_typed_array())
        {
            cursor_visitor_.dump(visitor, *this, ec);
        }
        else if (is_begin_container(current().event_type()))
        {
            parser_.cursor_mode(false);
            parser_.mark_level(parser_.level());
            cursor_visitor_.event().send_json_event(visitor, *this, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return;
            }
            read_next(visitor, ec);
            parser_.cursor_mode(true);
            parser_.mark_level(0);
            if (current().event_type() == staj_event_type::begin_object)
            {
                cursor_visitor_.end_object(*this);
            }
            else
            {
                cursor_visitor_.end_array(*this);
            }
        }
        else
        {
            cursor_visitor_.event().send_json_event(visitor, *this, ec);
        }
    }